

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

ON_BezierCurve * __thiscall ON_BezierCurve::operator=(ON_BezierCurve *this,ON_PolynomialCurve *src)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  int pt_count;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ON_4dPointArray pt;
  ON_SimpleArray<ON_4dPoint> local_98;
  ON_SimpleArray<ON_4dPoint> local_80;
  ON_PolynomialCurve local_68;
  
  if ((src->m_dim < 1) ||
     (src->m_order < 2 || (src->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_count != src->m_order)) {
    if ((this->m_cv != (double *)0x0) && (0 < this->m_cv_capacity)) {
      onfree(this->m_cv);
    }
    *(undefined8 *)&this->m_cv_stride = 0;
    *(undefined8 *)((long)&this->m_cv + 4) = 0;
    this->m_dim = 0;
    this->m_is_rat = 0;
    this->m_order = 0;
    this->m_cv_stride = 0;
  }
  else {
    ON_PolynomialCurve::ON_PolynomialCurve(&local_68);
    local_68.m_dim = 4;
    if (src->m_is_rat == 0) {
      local_68.m_dim = src->m_dim;
    }
    local_68.m_is_rat = 0;
    local_68.m_domain.m_t[0]._0_4_ = 0;
    local_68.m_domain.m_t[0]._4_4_ = 0;
    local_68.m_domain.m_t[1]._0_4_ = 0;
    local_68.m_domain.m_t[1]._4_4_ = 0x3ff00000;
    local_68.m_order = src->m_order;
    ON_4dPointArray::operator=(&local_68.m_cv,&src->m_cv);
    if (src->m_is_rat != 0) {
      this->m_dim = this->m_dim + 1;
      this->m_is_rat = 0;
    }
    iVar6 = src->m_order;
    ON_4dPointArray::ON_4dPointArray((ON_4dPointArray *)&local_98,iVar6);
    if (0 < src->m_order) {
      lVar7 = (long)iVar6 + -1;
      lVar5 = 0;
      lVar8 = 0;
      do {
        if (lVar5 == 0) {
          dVar1 = 0.0;
        }
        else {
          dVar1 = 1.0;
          if (lVar8 < lVar7) {
            dVar1 = (double)(int)lVar8 * (1.0 / (double)(int)lVar7);
          }
        }
        pdVar4 = ON_4dPoint::operator_cast_to_double_
                           ((ON_4dPoint *)((long)&(local_98.m_a)->x + lVar5));
        ON_PolynomialCurve::Evaluate(&local_68,dVar1,0,4,pdVar4);
        lVar8 = lVar8 + 1;
        lVar5 = lVar5 + 0x20;
      } while (lVar8 < src->m_order);
    }
    ON_4dPointArray::ON_4dPointArray((ON_4dPointArray *)&local_80,0);
    ON_4dPointArray::operator=(&local_68.m_cv,(ON_4dPointArray *)&local_80);
    ON_SimpleArray<ON_4dPoint>::~ON_SimpleArray(&local_80);
    iVar6 = src->m_dim;
    iVar3 = src->m_is_rat;
    pt_count = src->m_order;
    if (0 < pt_count && (iVar6 < 3 && iVar3 != 0)) {
      lVar7 = 0;
      lVar5 = 0;
      do {
        dVar1 = *(double *)((long)&(local_98.m_a)->w + lVar7);
        pdVar4 = ON_4dPoint::operator[]((ON_4dPoint *)((long)&(local_98.m_a)->x + lVar7),src->m_dim)
        ;
        *pdVar4 = dVar1;
        lVar5 = lVar5 + 1;
        pt_count = src->m_order;
        lVar7 = lVar7 + 0x20;
      } while (lVar5 < pt_count);
      iVar6 = src->m_dim;
      iVar3 = src->m_is_rat;
    }
    Loft(this,(iVar6 + 1) - (uint)(iVar3 == 0),pt_count,4,&(local_98.m_a)->x,0,(double *)0x0);
    bVar2 = IsValid(this);
    if ((bVar2) && (src->m_is_rat != 0)) {
      this->m_is_rat = 1;
      this->m_dim = this->m_dim + -1;
    }
    ON_SimpleArray<ON_4dPoint>::~ON_SimpleArray(&local_98);
    ON_PolynomialCurve::~ON_PolynomialCurve(&local_68);
  }
  return this;
}

Assistant:

ON_BezierCurve& ON_BezierCurve::operator=(const ON_PolynomialCurve& src)
{
  //m_domain = src.m_domain;
  if ( src.m_dim > 0 && src.m_cv.Count() == src.m_order && src.m_order >= 2 ) 
  {
    int i;
    
    ON_PolynomialCurve s; // scratch poly for homogeneous evaluation
    s.m_dim = src.m_is_rat ? 4 : src.m_dim; 
    s.m_is_rat = 0;
    s.m_domain.m_t[0] = 0.0;
    s.m_domain.m_t[1] = 1.0;
    s.m_order = src.m_order;
    s.m_cv = src.m_cv;

    if ( src.m_is_rat ) {
      m_dim++;
      m_is_rat = 0;
    }     
    const int degree = src.m_order-1;
    const double d = 1.0/degree;
    double t;
    ON_4dPointArray pt(src.m_order);
    for ( i = 0; i < src.m_order; i++ ) 
    {
      if ( i == 0 )
        t = 0.0;
      else if ( i < degree )
        t = i*d;
      else
        t = 1.0;
      s.Evaluate( t, 0, 4, pt[i] );
    }
    s.m_cv = 0;
    if ( src.m_is_rat && src.m_dim < 3 ) {
      for ( i = 0; i < src.m_order; i++ )
        pt[i][src.m_dim] = pt[i].w;
    }
    Loft( src.m_is_rat ? src.m_dim+1 : src.m_dim, src.m_order, 4, &pt[0].x, 0, nullptr );
    if ( IsValid() && src.m_is_rat ) {
      m_is_rat = 1;
      m_dim--;
    }
  }
  else {
    Destroy();
  }
  
  return *this;
}